

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_common.hpp
# Opt level: O0

void __thiscall
afsm::test::state_name::
on_exit<afsm::test::events::ready_for_query_const&,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>
          (state_name *this,ready_for_query *param_1,
          inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *param_2)

{
  ansi_color val;
  ostream *poVar1;
  string local_48 [36];
  int local_24;
  inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  *local_20;
  inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  *param_2_local;
  ready_for_query *param_1_local;
  state_name *this_local;
  
  local_20 = param_2;
  param_2_local =
       (inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        *)param_1;
  param_1_local = (ready_for_query *)this;
  val = psst::operator|(cyan,dim);
  poVar1 = psst::operator<<((ostream *)&std::cerr,val);
  local_24 = (int)std::setw(0x11);
  poVar1 = std::operator<<(poVar1,(_Setw)local_24);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::left);
  poVar1 = std::operator<<(poVar1,(string *)events::ready_for_query::name_abi_cxx11_);
  poVar1 = psst::operator<<(poVar1,clear);
  poVar1 = std::operator<<(poVar1,": Exit ");
  (*this->_vptr_state_name[2])();
  poVar1 = std::operator<<(poVar1,local_48);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
    on_exit(Event&&, FSM&)
    {
        using decayed_event = typename ::std::decay<Event>::type;
        using ::psst::ansi_color;
        ::std::cerr
             << (ansi_color::cyan | ansi_color::dim)
             << ::std::setw(event_name_width) << ::std::left
             << decayed_event::name << ansi_color::clear
             << ": Exit " << name() << "\n";
    }